

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::computeCoTest(SPxSolverBase<double> *this)

{
  int iVar1;
  Status stat;
  SPxOut *pSVar2;
  ostream *poVar3;
  undefined8 uVar4;
  double dVar5;
  char cVar6;
  char *pcVar7;
  long lVar8;
  DIdxSet *this_00;
  int iVar9;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  Verbosity old_verbosity;
  Verbosity local_50 [2];
  undefined1 local_48 [16];
  DIdxSet *local_38;
  
  dVar5 = leavetol(this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViol = 0.0;
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  iVar1 = (this->thecovectors->set).thenum;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = dVar5;
  local_48._12_4_ = extraout_XMM0_Dd;
  iVar9 = (int)((double)iVar1 * this->sparsePricingFactor);
  if (0 < (long)iVar1) {
    this_00 = &this->infeasibilities;
    local_48._0_8_ = (ulong)dVar5 ^ 0x8000000000000000;
    local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    lVar8 = (long)iVar1 + 1;
    do {
      stat = ((this->super_SPxBasisBase<double>).thedesc.costat)->data[lVar8 + -2];
      if (this->theRep * stat < 1) {
        dVar5 = coTest(this,(int)lVar8 + -2,stat);
        (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8 + -2] = dVar5;
        if (this->remainingRoundsEnter == 0) {
          if ((double)local_48._0_8_ <= dVar5) {
            (this->isInfeasible).data[lVar8 + -2] = 0;
          }
          else {
            this->m_pricingViol = this->m_pricingViol - dVar5;
            DIdxSet::addIdx(this_00,(int)lVar8 + -2);
            (this->isInfeasible).data[lVar8 + -2] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if (iVar9 < (this->infeasibilities).super_IdxSet.num) {
            pSVar2 = this->spxout;
            if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
              local_50[1] = 4;
              local_50[0] = pSVar2->m_verbosity;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,local_50 + 1);
              pSVar2 = this->spxout;
              local_38 = this_00;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
              cVar6 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                              cVar6);
              this_00 = local_38;
              std::ostream::put(cVar6);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
            }
            this->remainingRoundsEnter = 5;
            this->sparsePricingEnter = false;
            (this->infeasibilities).super_IdxSet.num = 0;
          }
        }
        else if (dVar5 < (double)local_48._0_8_) {
          this->m_pricingViol = this->m_pricingViol - dVar5;
          this->m_numViol = this->m_numViol + 1;
        }
      }
      else {
        (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8 + -2] = 0.0;
        if (this->remainingRoundsEnter == 0) {
          (this->isInfeasible).data[lVar8 + -2] = 0;
        }
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  iVar1 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar1 <= iVar9) && (this->sparsePricingEnter == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_50[0] = pSVar2->m_verbosity, 3 < (int)local_50[0])) {
      local_50[1] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar4 = *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar7 = " --- using hypersparse pricing, ";
        lVar8 = 0x20;
      }
      else {
        pcVar7 = " --- using sparse pricing, ";
        lVar8 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar8);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = 4;
      std::ostream::_M_insert<double>
                ((double)(this->infeasibilities).super_IdxSet.num /
                 (double)(this->thecovectors->set).thenum);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = (long)(int)uVar4;
      std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}